

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<unsigned_char>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  byte bVar4;
  data_t dVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  data_t *pdVar9;
  idx_t row_idx;
  bool bVar10;
  
  pdVar2 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar9 = target + target_offset;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      psVar3 = adata->sel->sel_vector;
      uVar6 = offset;
      if (psVar3 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar3[offset];
      }
      bVar4 = pdVar2[uVar6];
      bVar8 = (byte)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
      if (bVar4 <= bVar8) {
        bVar8 = bVar4;
      }
      uVar1 = *(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
      (stats->statistics).stats_union.string_data.max[0] = bVar8;
      bVar8 = (byte)uVar1;
      if (bVar8 <= bVar4) {
        bVar8 = bVar4;
      }
      *(byte *)((long)&(stats->statistics).stats_union + 0x18) = bVar8;
      *pdVar9 = pdVar2[uVar6];
      pdVar9 = pdVar9 + 1;
      offset = offset + 1;
    }
  }
  else {
    pdVar9 = target + target_offset;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      psVar3 = adata->sel->sel_vector;
      row_idx = offset;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[offset];
      }
      bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar10) {
        bVar4 = pdVar2[row_idx];
        bVar8 = (byte)*(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
        bVar7 = (byte)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
        if (bVar4 <= bVar7) {
          bVar7 = bVar4;
        }
        if (bVar4 < bVar8) {
          bVar4 = bVar8;
        }
        (stats->statistics).stats_union.string_data.max[0] = bVar7;
        *(byte *)((long)&(stats->statistics).stats_union + 0x18) = bVar4;
        dVar5 = pdVar2[row_idx];
      }
      else {
        dVar5 = '\0';
      }
      *pdVar9 = dVar5;
      pdVar9 = pdVar9 + 1;
      offset = offset + 1;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}